

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_si_iec_units.cpp
# Opt level: O1

string * __thiscall
tlx::format_iec_units_abi_cxx11_
          (string *__return_storage_ptr__,tlx *this,uint64_t number,int precision)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  ostringstream out;
  char local_1a9;
  double local_1a8;
  double dStack_1a0;
  long local_198;
  long local_190 [2];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  auVar5._8_4_ = (int)((ulong)this >> 0x20);
  auVar5._0_8_ = this;
  auVar5._12_4_ = 0x45300000;
  dStack_1a0 = auVar5._8_8_ - 1.9342813113834067e+25;
  local_1a8 = dStack_1a0 + ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0);
  uVar4 = 0;
  if ((tlx *)0x3ff < this) {
    do {
      local_1a8 = local_1a8 * 0.0009765625;
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (1024.0 <= local_1a8);
    uVar4 = (ulong)uVar3;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 4;
  *(long *)((long)local_190 + *(long *)(local_198 + -0x18)) = (long)(int)number;
  poVar1 = std::ostream::_M_insert<double>(local_1a8);
  local_1a9 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a9,1);
  __s = format_iec_units::IEC_endings[uVar4];
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string format_iec_units(uint64_t number, int precision) {
    // may not overflow, std::numeric_limits<uint64_t>::max() == 16 EiB
    double multiplier = 1024.0;
    static const char* IEC_endings[] = {
        "", "Ki", "Mi", "Gi", "Ti", "Pi", "Ei"
    };
    unsigned int scale = 0;
    double number_d = static_cast<double>(number);
    while (number_d >= multiplier) {
        number_d /= multiplier;
        ++scale;
    }
    std::ostringstream out;
    out << std::fixed << std::setprecision(precision) << number_d
        << ' ' << IEC_endings[scale];
    return out.str();
}